

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

QPainterPath __thiscall QPainterPath::simplified(QPainterPath *this)

{
  QPainterPathPrivate *pQVar1;
  QPainterPath *in_RSI;
  long in_FS_OFFSET;
  QPainterPath local_60;
  undefined1 local_58 [24];
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (in_RSI->d_ptr).d.ptr;
  if ((pQVar1 == (QPainterPathPrivate *)0x0) ||
     (((pQVar1->elements).d.size == 1 && (((pQVar1->elements).d.ptr)->type == MoveToElement)))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QPainterPath(this,in_RSI);
      return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
    }
  }
  else {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath(&local_60);
    QPathClipper::QPathClipper((QPathClipper *)local_58,in_RSI,&local_60);
    ~QPainterPath(&local_60);
    QPathClipper::clip((QPathClipper *)this,(Operation)(QPathClipper *)local_58);
    ~QPainterPath((QPainterPath *)(local_58 + 8));
    ~QPainterPath((QPainterPath *)local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QPainterPath::simplified() const
{
    if (isEmpty())
        return *this;
    QPathClipper clipper(*this, QPainterPath());
    return clipper.clip(QPathClipper::Simplify);
}